

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::TextTreeRenderer::SplitStringBuffer
          (TextTreeRenderer *this,string *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result)

{
  byte bVar1;
  size_t len;
  idx_t iVar2;
  char *s;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t pos;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  len = source->_M_string_length;
  if (len == 0) {
    local_78 = 0;
  }
  else {
    iVar2 = (this->config).node_render_width;
    s = (source->_M_dataplus)._M_p;
    local_78 = 0;
    lVar6 = 0;
    uVar5 = 0;
    pos = 0;
    do {
      sVar3 = Utf8Proc::RenderWidth(s,len,pos);
      sVar4 = Utf8Proc::NextGraphemeCluster(s,len,pos);
      if (iVar2 - 2 < lVar6 + sVar3) {
        if (uVar5 < local_78 + 8) {
          uVar5 = pos;
        }
        ::std::__cxx11::string::substr((ulong)&local_50,(ulong)source);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        lVar6 = pos - uVar5;
        pos = uVar5;
        local_78 = uVar5;
      }
      bVar1 = (source->_M_dataplus)._M_p[pos];
      if ((((char)bVar1 < '0') ||
          ((bVar1 - 0x3a < 0x27 && ((0x7e0000007fU >> ((ulong)(bVar1 - 0x3a) & 0x3f) & 1) != 0))))
         && (bVar1 != 0x5f)) {
        uVar5 = pos;
      }
      lVar6 = lVar6 + sVar3;
      pos = sVar4;
    } while (sVar4 < len);
  }
  if (local_78 < len) {
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)source);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,&local_50
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void TextTreeRenderer::SplitStringBuffer(const string &source, vector<string> &result) {
	D_ASSERT(Utf8Proc::IsValid(source.c_str(), source.size()));
	const idx_t max_line_render_size = config.node_render_width - 2;
	// utf8 in prompt, get render width
	idx_t character_pos = 0;
	idx_t start_pos = 0;
	idx_t render_width = 0;
	idx_t last_possible_split = 0;

	const idx_t size = source.size();
	const char *input = source.c_str();

	while (character_pos < size) {
		size_t char_render_width = Utf8Proc::RenderWidth(input, size, character_pos);
		idx_t next_character_pos = Utf8Proc::NextGraphemeCluster(input, size, character_pos);

		// Does the next character make us exceed the line length?
		if (render_width + char_render_width > max_line_render_size) {
			if (start_pos + 8 > last_possible_split) {
				// The last character we can split on is one of the first 8 characters of the line
				// to not create very small lines we instead split on the current character
				last_possible_split = character_pos;
			}
			result.push_back(source.substr(start_pos, last_possible_split - start_pos));
			render_width = character_pos - last_possible_split;
			start_pos = last_possible_split;
			character_pos = last_possible_split;
		}
		// check if we can split on this character
		if (CanSplitOnThisChar(source[character_pos])) {
			last_possible_split = character_pos;
		}
		character_pos = next_character_pos;
		render_width += char_render_width;
	}
	if (size > start_pos) {
		// append the remainder of the input
		result.push_back(source.substr(start_pos, size - start_pos));
	}
}